

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int __thiscall
pybind11::detail::process_attribute<pybind11::arg_v,_void>::init
          (process_attribute<pybind11::arg_v,_void> *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  function_record *__args;
  bool bVar2;
  vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
  *pvVar3;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__args_1;
  handle *__args_2;
  reference pvVar4;
  bool local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  PyObject *local_218;
  str local_210;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  PyObject *local_180;
  str local_178;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string descr;
  handle local_28;
  void *local_20;
  EVP_PKEY_CTX *local_18;
  function_record *r_local;
  arg_v *a_local;
  
  local_18 = ctx;
  r_local = (function_record *)this;
  if ((((byte)ctx[0x59] >> 5 & 1) != 0) &&
     (bVar2 = std::
              vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ::empty((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)(ctx + 0x18)), bVar2)) {
    pvVar3 = (vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
              *)(local_18 + 0x18);
    local_20 = (void *)0x0;
    memset(&local_28,0,8);
    handle::handle(&local_28);
    descr.field_2._M_local_buf[0xf] = '\x01';
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool>
              (pvVar3,(char (*) [5])"self",&local_20,&local_28,
               (bool *)(descr.field_2._M_local_buf + 0xf));
  }
  bVar2 = handle::operator_cast_to_bool((handle *)&r_local->signature);
  __args = r_local;
  if (bVar2) {
    pvVar3 = (vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
              *)(local_18 + 0x18);
    __args_1 = &r_local->args;
    __args_2 = handle::inc_ref((handle *)&r_local->signature);
    local_2c1 = (bool)((*(byte *)&r_local->doc & 1 ^ 0xff) & 1);
    pvVar4 = std::
             vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
             ::emplace_back<char_const*const&,char_const*const&,pybind11::handle_const&,bool>
                       (pvVar3,&__args->name,(char **)__args_1,__args_2,&local_2c1);
    return (int)pvVar4;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"\'",&local_51);
  std::allocator<char>::~allocator(&local_51);
  if (r_local->name != (char *)0x0) {
    pcVar1 = r_local->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar1,&local_a9);
    std::operator+(&local_88,&local_a8,": ");
    std::__cxx11::string::operator+=((string *)local_50,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(r_local->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_finish,"\'");
  std::__cxx11::string::operator+=((string *)local_50,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (((byte)local_18[0x59] >> 5 & 1) == 0) {
    if (*(long *)local_18 != 0) {
      pcVar1 = *(char **)local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar1,&local_279);
      std::operator+(&local_258," in function \'",&local_278);
      std::operator+(&local_238,&local_258,"\'");
      std::__cxx11::string::operator+=((string *)local_50,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
    }
  }
  else if (*(long *)local_18 == 0) {
    local_218 = *(PyObject **)(local_18 + 0x68);
    str::str(&local_210,(handle)local_218);
    str::operator_cast_to_string(&local_208,&local_210);
    std::operator+(&local_1e8," in method of \'",&local_208);
    std::operator+(&local_1c8,&local_1e8,"\'");
    std::__cxx11::string::operator+=((string *)local_50,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    str::~str(&local_210);
  }
  else {
    local_180 = *(PyObject **)(local_18 + 0x68);
    str::str(&local_178,(handle)local_180);
    str::operator_cast_to_string(&local_170,&local_178);
    std::operator+(&local_150," in method \'",&local_170);
    std::operator+(&local_130,&local_150,".");
    pcVar1 = *(char **)local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,pcVar1,&local_1a1);
    std::operator+(&local_110,&local_130,&local_1a0);
    std::operator+(&local_f0,&local_110,"\'");
    std::__cxx11::string::operator+=((string *)local_50,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    str::~str(&local_178);
  }
  std::operator+(&local_2c0,"arg(): could not convert default argument ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(&local_2a0,&local_2c0," into a Python object (type not registered yet?)");
  pybind11_fail(&local_2a0);
}

Assistant:

static void init(const arg_v &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr /*descr*/, handle() /*parent*/, true /*convert*/);

        if (!a.value) {
#if !defined(NDEBUG)
            std::string descr("'");
            if (a.name) descr += std::string(a.name) + ": ";
            descr += a.type + "'";
            if (r->is_method) {
                if (r->name)
                    descr += " in method '" + (std::string) str(r->scope) + "." + (std::string) r->name + "'";
                else
                    descr += " in method of '" + (std::string) str(r->scope) + "'";
            } else if (r->name) {
                descr += " in function '" + (std::string) r->name + "'";
            }
            pybind11_fail("arg(): could not convert default argument "
                          + descr + " into a Python object (type not registered yet?)");
#else
            pybind11_fail("arg(): could not convert default argument "
                          "into a Python object (type not registered yet?). "
                          "Compile in debug mode for more information.");
#endif
        }
        r->args.emplace_back(a.name, a.descr, a.value.inc_ref(), !a.flag_noconvert);
    }